

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void __thiscall absl::lts_20240722::Cord::DestroyCordSlow(Cord *this)

{
  CordzInfo *pCVar1;
  Nonnull<absl::cord_internal::CordRep_*> node;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
    pCVar1 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (pCVar1 != (CordzInfo *)0x0) {
      absl::lts_20240722::cord_internal::CordzInfo::Untrack();
    }
    node = InlineRep::as_tree(&this->contents_);
    VerifyTree(node);
    cord_internal::CordRep::Unref(node);
    return;
  }
  __assert_fail("contents_.is_tree()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x16b,"void absl::Cord::DestroyCordSlow()");
}

Assistant:

void Cord::DestroyCordSlow() {
  assert(contents_.is_tree());
  CordzInfo::MaybeUntrackCord(contents_.cordz_info());
  CordRep::Unref(VerifyTree(contents_.as_tree()));
}